

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.cpp
# Opt level: O0

void __thiscall de::Process::closeStdErr(Process *this)

{
  deBool dVar1;
  ProcessError *this_00;
  char *__s;
  allocator<char> local_3d [13];
  string local_30;
  Process *local_10;
  Process *this_local;
  
  local_10 = this;
  dVar1 = deProcess_closeStdErr(this->m_process);
  if (dVar1 == 0) {
    this_00 = (ProcessError *)__cxa_allocate_exception(0x10);
    __s = deProcess_getLastError(this->m_process);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,local_3d);
    ProcessError::ProcessError(this_00,&local_30);
    __cxa_throw(this_00,&ProcessError::typeinfo,ProcessError::~ProcessError);
  }
  return;
}

Assistant:

void Process::closeStdErr (void)
{
	if (!deProcess_closeStdErr(m_process))
		throw ProcessError(deProcess_getLastError(m_process));
}